

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32_stage6_sse4_1
               (__m128i *bf1,__m128i *cospim32,__m128i *cospi32,__m128i *cospim16,__m128i *cospi48,
               __m128i *cospi16,__m128i *cospim48,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rounding,int bit)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i *out0;
  __m128i *in_R9;
  __m128i *out1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i temp2;
  __m128i temp1;
  __m128i *in_stack_00000020;
  __m128i *in_stack_ffffffffffffffa8;
  undefined8 uVar1;
  __m128i *in_stack_ffffffffffffffb0;
  undefined8 uVar2;
  
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x50),in_RDX,(__m128i *)(in_RDI + 0x60),
                  in_stack_00000020,(int)cospi16);
  out1 = (__m128i *)((ulong)cospi16 & 0xffffffff);
  out0 = in_stack_00000020;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x50),in_RDX,(__m128i *)(in_RDI + 0x60),
                  in_stack_00000020,(int)cospi16);
  *(undefined8 *)(in_RDI + 0x60) = extraout_XMM0_Qa_00;
  *(undefined8 *)(in_RDI + 0x68) = extraout_XMM0_Qb_00;
  *(undefined8 *)(in_RDI + 0x50) = extraout_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x58) = extraout_XMM0_Qb;
  in0[0] = in_RDI + 0x80;
  in0[1] = in_RDI + 0xb0;
  addsub_sse4_1(in0,temp1,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_00[0] = in_RDI + 0x90;
  in0_00[1] = in_RDI + 0xa0;
  addsub_sse4_1(in0_00,temp1,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_01[0] = in_RDI + 0xf0;
  in0_01[1] = in_RDI + 0xc0;
  addsub_sse4_1(in0_01,temp1,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_02[0] = in_RDI + 0xe0;
  in0_02[1] = in_RDI + 0xd0;
  addsub_sse4_1(in0_02,temp1,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x120),in_R8,(__m128i *)(in_RDI + 0x1d0),
                  in_stack_00000020,(int)cospi16);
  half_btf_sse4_1(in_R8,(__m128i *)(in_RDI + 0x120),in_R9,(__m128i *)(in_RDI + 0x1d0),
                  in_stack_00000020,(int)cospi16);
  *(undefined8 *)(in_RDI + 0x1d0) = extraout_XMM0_Qa_02;
  *(undefined8 *)(in_RDI + 0x1d8) = extraout_XMM0_Qb_02;
  *(undefined8 *)(in_RDI + 0x120) = extraout_XMM0_Qa_01;
  *(undefined8 *)(in_RDI + 0x128) = extraout_XMM0_Qb_01;
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x130),in_R8,(__m128i *)(in_RDI + 0x1c0),
                  in_stack_00000020,(int)cospi16);
  uVar1 = extraout_XMM0_Qa_03;
  uVar2 = extraout_XMM0_Qb_03;
  half_btf_sse4_1(in_R8,(__m128i *)(in_RDI + 0x130),in_R9,(__m128i *)(in_RDI + 0x1c0),
                  in_stack_00000020,(int)cospi16);
  *(undefined8 *)(in_RDI + 0x1c0) = extraout_XMM0_Qa_04;
  *(undefined8 *)(in_RDI + 0x1c8) = extraout_XMM0_Qb_04;
  *(undefined8 *)(in_RDI + 0x130) = uVar1;
  *(undefined8 *)(in_RDI + 0x138) = uVar2;
  half_btf_sse4_1((__m128i *)temp2[1],(__m128i *)(in_RDI + 0x140),in_RCX,(__m128i *)(in_RDI + 0x1b0)
                  ,in_stack_00000020,(int)cospi16);
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x140),in_R8,(__m128i *)(in_RDI + 0x1b0),
                  in_stack_00000020,(int)cospi16);
  *(undefined8 *)(in_RDI + 0x1b0) = extraout_XMM0_Qa_06;
  *(undefined8 *)(in_RDI + 0x1b8) = extraout_XMM0_Qb_06;
  *(undefined8 *)(in_RDI + 0x140) = extraout_XMM0_Qa_05;
  *(undefined8 *)(in_RDI + 0x148) = extraout_XMM0_Qb_05;
  half_btf_sse4_1((__m128i *)temp2[1],(__m128i *)(in_RDI + 0x150),in_RCX,(__m128i *)(in_RDI + 0x1a0)
                  ,in_stack_00000020,(int)cospi16);
  uVar1 = extraout_XMM0_Qa_07;
  uVar2 = extraout_XMM0_Qb_07;
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x150),in_R8,(__m128i *)(in_RDI + 0x1a0),
                  in_stack_00000020,(int)cospi16);
  *(undefined8 *)(in_RDI + 0x1a0) = extraout_XMM0_Qa_08;
  *(undefined8 *)(in_RDI + 0x1a8) = extraout_XMM0_Qb_08;
  *(undefined8 *)(in_RDI + 0x150) = uVar1;
  *(undefined8 *)(in_RDI + 0x158) = uVar2;
  return;
}

Assistant:

static inline void idct32_stage6_sse4_1(
    __m128i *bf1, const __m128i *cospim32, const __m128i *cospi32,
    const __m128i *cospim16, const __m128i *cospi48, const __m128i *cospi16,
    const __m128i *cospim48, const __m128i *clamp_lo, const __m128i *clamp_hi,
    const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  temp1 = half_btf_sse4_1(cospim32, &bf1[5], cospi32, &bf1[6], rounding, bit);
  bf1[6] = half_btf_sse4_1(cospi32, &bf1[5], cospi32, &bf1[6], rounding, bit);
  bf1[5] = temp1;

  addsub_sse4_1(bf1[8], bf1[11], bf1 + 8, bf1 + 11, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[9], bf1[10], bf1 + 9, bf1 + 10, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[15], bf1[12], bf1 + 15, bf1 + 12, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[14], bf1[13], bf1 + 14, bf1 + 13, clamp_lo, clamp_hi);

  temp1 = half_btf_sse4_1(cospim16, &bf1[18], cospi48, &bf1[29], rounding, bit);
  bf1[29] =
      half_btf_sse4_1(cospi48, &bf1[18], cospi16, &bf1[29], rounding, bit);
  bf1[18] = temp1;
  temp2 = half_btf_sse4_1(cospim16, &bf1[19], cospi48, &bf1[28], rounding, bit);
  bf1[28] =
      half_btf_sse4_1(cospi48, &bf1[19], cospi16, &bf1[28], rounding, bit);
  bf1[19] = temp2;
  temp1 =
      half_btf_sse4_1(cospim48, &bf1[20], cospim16, &bf1[27], rounding, bit);
  bf1[27] =
      half_btf_sse4_1(cospim16, &bf1[20], cospi48, &bf1[27], rounding, bit);
  bf1[20] = temp1;
  temp2 =
      half_btf_sse4_1(cospim48, &bf1[21], cospim16, &bf1[26], rounding, bit);
  bf1[26] =
      half_btf_sse4_1(cospim16, &bf1[21], cospi48, &bf1[26], rounding, bit);
  bf1[21] = temp2;
}